

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O3

void testCompositeDeepScanLine(string *tempDir)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nTesting deep compositing interface basic functionality:\n",
             0x3a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  bVar1 = IlmThread_3_2::supportsThreads();
  random_reseed(1);
  bVar2 = 1;
  do {
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x0,1,1,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x0,1,0,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x0,1,1,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x0,1,0,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x1,1,1,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x1,1,0,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x1,1,1,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x1,1,0,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Testing deep compositing across multiple parts:\n",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x0,5,1,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x0,5,0,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x0,5,1,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x0,5,0,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x1,3,1,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x1,3,0,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x1,3,1,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x1,3,0,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x1,4,1,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<float>
              ((anon_unknown_dwarf_84eae *)0x1,4,0,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x1,4,1,false,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    anon_unknown.dwarf_84eae::test_parts<Imath_3_2::half>
              ((anon_unknown_dwarf_84eae *)0x1,4,0,true,SUB81((tempDir->_M_dataplus)._M_p,0),
               (string *)tempDir->_M_string_length);
    if ((bVar1 & bVar2) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," testing with multithreading...\n",0x20);
      Imf_3_2::setGlobalThreadCount(0x40);
    }
    bVar3 = bVar2 != 0;
    bVar2 = 0;
  } while (bVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ok\n",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void
testCompositeDeepScanLine (const std::string& tempDir)
{

    cout << "\n\nTesting deep compositing interface basic functionality:\n"
         << endl;

    int passes = 2;
    if (!ILMTHREAD_NAMESPACE::supportsThreads ()) { passes = 1; }

    random_reseed (1);

    for (int pass = 0; pass < 2; pass++)
    {

        test_parts<float> (0, 1, true, true, tempDir);
        test_parts<float> (0, 1, false, false, tempDir);
        test_parts<half> (0, 1, true, false, tempDir);
        test_parts<half> (0, 1, false, true, tempDir);

        //
        // test pattern 1: tested by confirming data is written correctly and
        // then reading correct results in Nuke
        //
        test_parts<float> (1, 1, true, false, tempDir);
        test_parts<float> (1, 1, false, true, tempDir);
        test_parts<half> (1, 1, true, true, tempDir);
        test_parts<half> (1, 1, false, false, tempDir);

        cout << "Testing deep compositing across multiple parts:\n" << endl;

        test_parts<float> (0, 5, true, false, tempDir);
        test_parts<float> (0, 5, false, true, tempDir);
        test_parts<half> (0, 5, true, false, tempDir);
        test_parts<half> (0, 5, false, true, tempDir);

        test_parts<float> (1, 3, true, true, tempDir);
        test_parts<float> (1, 3, false, false, tempDir);
        test_parts<half> (1, 3, true, true, tempDir);
        test_parts<half> (1, 3, false, false, tempDir);

        test_parts<float> (1, 4, true, true, tempDir);
        test_parts<float> (1, 4, false, false, tempDir);
        test_parts<half> (1, 4, true, false, tempDir);
        test_parts<half> (1, 4, false, true, tempDir);

        if (passes == 2 && pass == 0)
        {
            cout << " testing with multithreading...\n";
            setGlobalThreadCount (64);
        }
    }
    cout << " ok\n" << endl;
}